

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

RepeatedField<long> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  internal::ShortSooRep::ShortSooRep((ShortSooRep *)ptr,*args);
  if ((*ptr & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)ptr);
  }
  return (RepeatedField<long> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }